

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

void age_spells(void)

{
  bool bVar1;
  int local_c;
  int i;
  
  local_c = 0;
  while( true ) {
    bVar1 = false;
    if (local_c < 0x2b) {
      bVar1 = spl_book[local_c].sp_id != 0;
    }
    if (!bVar1) break;
    if (spl_book[local_c].sp_know != 0) {
      spl_book[local_c].sp_know = spl_book[local_c].sp_know + -1;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void age_spells(void)
{
	int i;
	/*
	 * The time relative to the hero (a pass through move
	 * loop) causes all spell knowledge to be decremented.
	 * The hero's speed, rest status, conscious status etc.
	 * does not alter the loss of memory.
	 */
	for (i = 0; i < MAXSPELL && spellid(i) != NO_SPELL; i++)
	    if (spellknow(i))
		decrnknow(i);
	return;
}